

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1160.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  istream *piVar5;
  iterator __first;
  iterator __last;
  reference pvVar6;
  ostream *poVar7;
  int local_84;
  int j;
  int y;
  int x;
  int n2;
  int n1;
  int i_2;
  int i_1;
  value_type local_58 [2];
  int local_40;
  int local_3c;
  int l;
  int b;
  int a;
  int i;
  vector<e,_std::allocator<e>_> v;
  int local_10;
  int m;
  int n;
  
  m = 0;
  piVar5 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_10);
  std::istream::operator>>
            (piVar5,(int *)((long)&v.super__Vector_base<e,_std::allocator<e>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage + 4));
  std::vector<e,_std::allocator<e>_>::vector((vector<e,_std::allocator<e>_> *)&a);
  for (b = 0; b < v.super__Vector_base<e,_std::allocator<e>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage._4_4_; b = b + 1) {
    piVar5 = (istream *)std::istream::operator>>((istream *)&std::cin,&l);
    piVar5 = (istream *)std::istream::operator>>(piVar5,&local_3c);
    std::istream::operator>>(piVar5,&local_40);
    local_58[0].a = l + -1;
    local_58[0].b = local_3c + -1;
    local_58[0].l = local_40;
    std::vector<e,_std::allocator<e>_>::push_back((vector<e,_std::allocator<e>_> *)&a,local_58);
  }
  __first = std::vector<e,_std::allocator<e>_>::begin((vector<e,_std::allocator<e>_> *)&a);
  __last = std::vector<e,_std::allocator<e>_>::end((vector<e,_std::allocator<e>_> *)&a);
  std::sort<__gnu_cxx::__normal_iterator<e*,std::vector<e,std::allocator<e>>>,bool(*)(e,e)>
            ((__normal_iterator<e_*,_std::vector<e,_std::allocator<e>_>_>)__first._M_current,
             (__normal_iterator<e_*,_std::vector<e,_std::allocator<e>_>_>)__last._M_current,cmp);
  for (n1 = 1; n1 <= local_10; n1 = n1 + 1) {
    r[n1] = 0;
    t[n1] = n1;
  }
  for (n2 = 0; n2 < v.super__Vector_base<e,_std::allocator<e>_>._M_impl.super__Vector_impl_data.
                    _M_end_of_storage._4_4_; n2 = n2 + 1) {
    pvVar6 = std::vector<e,_std::allocator<e>_>::operator[]
                       ((vector<e,_std::allocator<e>_> *)&a,(long)n2);
    iVar3 = pvVar6->a;
    pvVar6 = std::vector<e,_std::allocator<e>_>::operator[]
                       ((vector<e,_std::allocator<e>_> *)&a,(long)n2);
    iVar4 = pvVar6->b;
    iVar1 = find(iVar3);
    iVar2 = find(iVar4);
    if (iVar1 != iVar2) {
      pvVar6 = std::vector<e,_std::allocator<e>_>::operator[]
                         ((vector<e,_std::allocator<e>_> *)&a,(long)n2);
      if (max < pvVar6->l) {
        pvVar6 = std::vector<e,_std::allocator<e>_>::operator[]
                           ((vector<e,_std::allocator<e>_> *)&a,(long)n2);
        max = pvVar6->l;
      }
      pvVar6 = std::vector<e,_std::allocator<e>_>::operator[]
                         ((vector<e,_std::allocator<e>_> *)&a,(long)n2);
      pvVar6->l = -pvVar6->l;
      iVar3 = find(iVar3);
      iVar4 = find(iVar4);
      if (r[iVar4] < r[iVar3]) {
        t[iVar4] = iVar3;
      }
      else {
        t[iVar3] = iVar4;
        if (r[iVar3] == r[iVar4]) {
          r[iVar4] = r[iVar4] + 1;
        }
      }
    }
  }
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,max);
  poVar7 = std::operator<<(poVar7,"\n");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_10 + -1);
  std::operator<<(poVar7,"\n");
  for (local_84 = 0;
      local_84 <
      v.super__Vector_base<e,_std::allocator<e>_>._M_impl.super__Vector_impl_data._M_end_of_storage.
      _4_4_; local_84 = local_84 + 1) {
    pvVar6 = std::vector<e,_std::allocator<e>_>::operator[]
                       ((vector<e,_std::allocator<e>_> *)&a,(long)local_84);
    if (pvVar6->l < 0) {
      pvVar6 = std::vector<e,_std::allocator<e>_>::operator[]
                         ((vector<e,_std::allocator<e>_> *)&a,(long)local_84);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pvVar6->a + 1);
      poVar7 = std::operator<<(poVar7," ");
      pvVar6 = std::vector<e,_std::allocator<e>_>::operator[]
                         ((vector<e,_std::allocator<e>_> *)&a,(long)local_84);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,pvVar6->b + 1);
      std::operator<<(poVar7,"\n");
    }
  }
  m = 0;
  std::vector<e,_std::allocator<e>_>::~vector((vector<e,_std::allocator<e>_> *)&a);
  return m;
}

Assistant:

int main() {
    int n, m;

    std::cin >> n >> m;
    std::vector<e> v;

    for (int i = 0; i < m; ++i) {
        int a, b, l;
        std::cin >> a >> b >> l;
        v.push_back({a - 1, b - 1, l});
    }

    std::sort(v.begin(), v.end(), cmp);

    for (int i = 1; i <= n; i++) {
        r[i] = 0;
        t[i] = i;
    }

    for (int i = 0; i < m; ++i) {
        int n1 = v[i].a;
        int n2 = v[i].b;

        if (find(n1) != find(n2)) {
            if (v[i].l > max) {
                max = v[i].l;
            }
            v[i].l *= -1;

            int x = find(n1);
            int y = find(n2);
            if (r[x] > r[y]) t[y] = x;
            else {
                t[x] = y;
                if (r[x] == r[y]) r[y]++;
            }
        }
    }

    std::cout << max << "\n" << n - 1 << "\n";

    for (int j = 0; j < m; ++j){
        if (v[j].l < 0){
            std::cout << v[j].a + 1 << " " << v[j].b + 1 << "\n";
        }
    }
    return 0;
}